

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.h
# Opt level: O0

void interpolate<int(*)[2],PointPlotter<int>>
               (int (*p0) [2],int (*pn) [2],PointPlotter<int> plot,double res)

{
  int (*in_RSI) [2];
  int (*in_RDI) [2];
  double dVar1;
  double dVar2;
  int (*p3) [2];
  int (*p2) [2];
  int (*p1) [2];
  double k2;
  double k1;
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  double in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  PointPlotter<int> in_stack_ffffffffffffff40;
  int (*local_48) [2];
  int (*local_40) [2];
  int (*local_38) [2];
  int (*local_10) [2];
  
  local_38 = in_RDI + 1;
  local_40 = in_RDI + 2;
  local_48 = in_RDI + 3;
  local_10 = in_RDI;
  do {
    if (local_40 == in_RSI) {
      return;
    }
    dVar1 = x<int(*)[2]>(local_38);
    dVar2 = x<int(*)[2]>(local_40);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      dVar1 = x<int(*)[2]>(local_10);
      dVar2 = x<int(*)[2]>(local_38);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
LAB_00167947:
        dVar1 = x<int(*)[2]>(local_10);
        dVar2 = x<int(*)[2]>(local_38);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          in_stack_ffffffffffffff40.f = (int *)x<int(*)[2]>(local_40);
          dVar1 = x<int(*)[2]>(local_48);
          if (((double)in_stack_ffffffffffffff40.f != dVar1) ||
             (NAN((double)in_stack_ffffffffffffff40.f) || NAN(dVar1))) {
            y<int(*)[2]>(local_40);
            y<int(*)[2]>(local_10);
            x<int(*)[2]>(local_40);
            x<int(*)[2]>(local_10);
            in_stack_ffffffffffffff08 = y<int(*)[2]>(local_48);
            dVar1 = y<int(*)[2]>(local_38);
            in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 - dVar1;
            x<int(*)[2]>(local_48);
            x<int(*)[2]>(local_38);
          }
          else {
            in_stack_ffffffffffffff10 = y<int(*)[2]>(local_40);
            in_stack_ffffffffffffff20 = y<int(*)[2]>(local_10);
            in_stack_ffffffffffffff20 = in_stack_ffffffffffffff10 - in_stack_ffffffffffffff20;
            in_stack_ffffffffffffff18 = x<int(*)[2]>(local_40);
            x<int(*)[2]>(local_10);
            in_stack_ffffffffffffff28 = y<int(*)[2]>(local_40);
            dVar1 = y<int(*)[2]>(local_38);
            in_stack_ffffffffffffff38 = (in_stack_ffffffffffffff28 - dVar1) * 3.0;
            in_stack_ffffffffffffff30 = x<int(*)[2]>(local_40);
            x<int(*)[2]>(local_38);
          }
        }
        else {
          y<int(*)[2]>(local_48);
          y<int(*)[2]>(local_38);
          x<int(*)[2]>(local_48);
          x<int(*)[2]>(local_38);
          y<int(*)[2]>(local_40);
          y<int(*)[2]>(local_38);
          x<int(*)[2]>(local_40);
          x<int(*)[2]>(local_38);
        }
      }
      else {
        dVar1 = x<int(*)[2]>(local_40);
        dVar2 = x<int(*)[2]>(local_48);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_00167947;
        y<int(*)[2]>(local_40);
        y<int(*)[2]>(local_38);
        x<int(*)[2]>(local_40);
        x<int(*)[2]>(local_38);
      }
      x<int(*)[2]>(local_38);
      y<int(*)[2]>(local_38);
      x<int(*)[2]>(local_40);
      y<int(*)[2]>(local_40);
      interpolate_forward_difference<PointPlotter<int>>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff08);
    }
    local_10 = local_10 + 1;
    local_38 = local_38 + 1;
    local_40 = local_40 + 1;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

inline
void interpolate(PointIter p0, PointIter pn, PointPlotter plot, double res)
{
  double k1, k2;

  // Set up points for first curve segment.
  PointIter p1 = p0; ++p1;
  PointIter p2 = p1; ++p2;
  PointIter p3 = p2; ++p3;

  // Draw each curve segment.
  for (; p2 != pn; ++p0, ++p1, ++p2, ++p3) {
    // p1 and p2 equal; single point.
    if (x(p1) == x(p2)) {
      continue;
    }
    // Both end points repeated; straight line.
    if (x(p0) == x(p1) && x(p2) == x(p3)) {
      k1 = k2 = (y(p2) - y(p1))/(x(p2) - x(p1));
    }
    // p0 and p1 equal; use f''(x1) = 0.
    else if (x(p0) == x(p1)) {
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
      k1 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k2)/2;
    }
    // p2 and p3 equal; use f''(x2) = 0.
    else if (x(p2) == x(p3)) {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (3*(y(p2) - y(p1))/(x(p2) - x(p1)) - k1)/2;
    }
    // Normal curve.
    else {
      k1 = (y(p2) - y(p0))/(x(p2) - x(p0));
      k2 = (y(p3) - y(p1))/(x(p3) - x(p1));
    }

    interpolate_segment(x(p1), y(p1), x(p2), y(p2), k1, k2, plot, res);
  }
}